

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,bool deterministic,uint8 *target)

{
  MessageLite *value;
  int iVar1;
  LogMessage *other;
  uint8 *puVar2;
  undefined4 extraout_var;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(0xb,target);
      puVar2 = WireFormatLite::WriteUInt32ToArray(2,number,puVar2);
      value = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) == 0) {
        puVar2 = WireFormatLite::InternalWriteMessageToArray(3,value,deterministic,puVar2);
      }
      else {
        iVar1 = (*value->_vptr_MessageLite[0x11])(value,3,(ulong)deterministic,puVar2);
        puVar2 = (uint8 *)CONCAT44(extraout_var,iVar1);
      }
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar2);
      return puVar2;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
               ,0x249);
    other = LogMessage::operator<<(&local_60,"Invalid message set extension.");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
    target = InternalSerializeFieldWithCachedSizesToArray(this,number,deterministic,target);
  }
  return target;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, bool deterministic, uint8* target) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, deterministic,
                                                        target);
  }

  if (is_cleared) return target;

  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, deterministic, target);
  } else {
    target = WireFormatLite::InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, *message_value, deterministic,
        target);
  }
  // End group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}